

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O3

void __thiscall CLI::App::_process_config_file(App *this)

{
  bool bVar1;
  pointer pbVar2;
  pointer pbVar3;
  bool bVar4;
  char *__s;
  size_t sVar5;
  FileError *this_00;
  Option *pOVar6;
  iterator __begin2;
  string *config_file;
  bool bVar7;
  string ename_string;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  config_files;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  string local_90;
  undefined1 local_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 local_40 [16];
  
  pOVar6 = this->config_ptr_;
  if (pOVar6 != (Option *)0x0) {
    bVar1 = (pOVar6->super_OptionBase<CLI::Option>).required_;
    pbVar2 = (pOVar6->results_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar3 = (pOVar6->results_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar7 = pbVar2 != pbVar3;
    if ((!bVar7) && ((pOVar6->envname_)._M_string_length != 0)) {
      local_b0 = &local_a0;
      local_a8 = 0;
      local_a0 = 0;
      __s = getenv((pOVar6->envname_)._M_dataplus._M_p);
      if (__s != (char *)0x0) {
        local_70._0_8_ = (string *)(local_70 + 0x10);
        sVar5 = strlen(__s);
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_70,__s,__s + sVar5);
        ::std::__cxx11::string::operator=((string *)&local_b0,(string *)local_70);
        if ((string *)local_70._0_8_ != (string *)(local_70 + 0x10)) {
          operator_delete((void *)local_70._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_70._16_8_)->_M_p + 1));
        }
        if (local_a8 != 0) {
          pOVar6 = this->config_ptr_;
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,local_b0,local_b0 + local_a8);
          Option::_add_result(pOVar6,&local_90,&pOVar6->results_);
          pOVar6->current_option_state_ = parsing;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
      }
      pOVar6 = this->config_ptr_;
    }
    Option::run_callback(pOVar6);
    Option::as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_70,this->config_ptr_);
    if ((local_70._0_8_ == local_70._8_8_) || (*(size_type *)(local_70._0_8_ + 8) == 0)) {
      if (bVar1 != false) {
        this_00 = (FileError *)__cxa_allocate_exception(0x38);
        local_50._M_allocated_capacity = (size_type)local_40;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"config file is required but none was given","");
        FileError::FileError(this_00,(string *)&local_50);
        __cxa_throw(this_00,&FileError::typeinfo,Error::~Error);
      }
    }
    else {
      config_file = (string *)local_70._0_8_;
      do {
        bVar4 = _process_config_file(this,config_file,(bool)(pbVar2 != pbVar3 | bVar1));
        bVar7 = (bool)(bVar7 | bVar4);
        config_file = config_file + 1;
      } while (config_file != (string *)local_70._8_8_);
      if (bVar7 == false) {
        pOVar6 = this->config_ptr_;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&pOVar6->results_,
                          (pOVar6->results_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        pOVar6->current_option_state_ = parsing;
        pOVar6 = this->config_ptr_;
        bVar1 = pOVar6->force_callback_;
        pOVar6->force_callback_ = false;
        Option::run_callback(pOVar6);
        this->config_ptr_->force_callback_ = bVar1;
      }
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_70);
  }
  return;
}

Assistant:

CLI11_INLINE void App::_process_config_file() {
    if(config_ptr_ != nullptr) {
        bool config_required = config_ptr_->get_required();
        auto file_given = config_ptr_->count() > 0;
        if(!(file_given || config_ptr_->envname_.empty())) {
            std::string ename_string = detail::get_environment_value(config_ptr_->envname_);
            if(!ename_string.empty()) {
                config_ptr_->add_result(ename_string);
            }
        }
        config_ptr_->run_callback();

        auto config_files = config_ptr_->as<std::vector<std::string>>();
        bool files_used{file_given};
        if(config_files.empty() || config_files.front().empty()) {
            if(config_required) {
                throw FileError("config file is required but none was given");
            }
            return;
        }
        for(const auto &config_file : config_files) {
            if(_process_config_file(config_file, config_required || file_given)) {
                files_used = true;
            }
        }
        if(!files_used) {
            // this is done so the count shows as 0 if no callbacks were processed
            config_ptr_->clear();
            bool force = config_ptr_->force_callback_;
            config_ptr_->force_callback_ = false;
            config_ptr_->run_callback();
            config_ptr_->force_callback_ = force;
        }
    }
}